

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O1

aiNode * __thiscall
Assimp::AC3DImporter::ConvertObjectSection
          (AC3DImporter *this,Object *object,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *outMaterials,
          vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
          *materials,aiNode *parent)

{
  float fVar1;
  float fVar2;
  float fVar3;
  iterator __position;
  pointer paVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  aiMesh *paVar10;
  vector<aiMesh*,std::allocator<aiMesh*>> *pvVar11;
  AC3DImporter *pAVar12;
  int iVar13;
  undefined4 uVar14;
  ai_uint32 aVar15;
  aiNode *paVar16;
  Logger *pLVar17;
  ulong uVar18;
  aiMesh *paVar19;
  aiMaterial *paVar20;
  ulong *puVar21;
  aiVector3D *__s;
  aiVector3D *paVar22;
  uint *puVar23;
  pointer ppVar24;
  Subdivider *pSVar25;
  pointer pcVar26;
  ulong *puVar27;
  void *__s_00;
  undefined4 *puVar28;
  aiNode **ppaVar29;
  aiNode *paVar30;
  runtime_error *prVar31;
  uint uVar32;
  aiFace *paVar33;
  aiFace *paVar34;
  ulong uVar35;
  char *__format;
  pointer pSVar36;
  long lVar37;
  uint uVar38;
  aiVector3D *paVar39;
  AC3DImporter *pAVar40;
  uint uVar41;
  pointer pSVar42;
  uint uVar43;
  pointer ppVar44;
  long lVar45;
  vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *pvVar46;
  pointer ppVar47;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> cpy;
  aiMesh *mesh;
  MatTable needMat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  uint local_c0;
  uint local_bc;
  Object *local_b8;
  aiMesh *local_b0;
  allocator_type local_a1;
  vector<aiMesh*,std::allocator<aiMesh*>> *local_a0;
  aiNode *local_98;
  vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *local_90;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_88;
  long local_70;
  AC3DImporter *local_68;
  AC3DImporter *local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  uint *local_40;
  pointer local_38;
  
  local_a0 = (vector<aiMesh*,std::allocator<aiMesh*>> *)meshes;
  local_68 = this;
  local_60 = (AC3DImporter *)outMaterials;
  paVar16 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar16);
  paVar16->mParent = parent;
  local_b8 = object;
  local_98 = paVar16;
  local_90 = materials;
  if ((object->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (object->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    if (((object->surfaces).
         super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
         ._M_impl.super__Vector_impl_data._M_finish ==
         (object->surfaces).
         super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
         ._M_impl.super__Vector_impl_data._M_start) || (object->numRefs == 0)) {
      pLVar17 = DefaultLogger::get();
      Logger::info(pLVar17,
                   "AC3D: No surfaces defined in object definition, a point list is returned");
      pcVar26 = (pointer)operator_new(0x520);
      pcVar26[0] = '\0';
      pcVar26[1] = '\0';
      pcVar26[2] = '\0';
      pcVar26[3] = '\0';
      pcVar26[4] = '\0';
      pcVar26[5] = '\0';
      pcVar26[6] = '\0';
      pcVar26[7] = '\0';
      pcVar26[8] = '\0';
      pcVar26[9] = '\0';
      pcVar26[10] = '\0';
      pcVar26[0xb] = '\0';
      memset(pcVar26 + 0x10,0,0xcc);
      pcVar26[0xe0] = '\0';
      pcVar26[0xe1] = '\0';
      pcVar26[0xe2] = '\0';
      pcVar26[0xe3] = '\0';
      pcVar26[0xe4] = '\0';
      pcVar26[0xe5] = '\0';
      pcVar26[0xe6] = '\0';
      pcVar26[0xe7] = '\0';
      pcVar26[0xe8] = '\0';
      pcVar26[0xe9] = '\0';
      pcVar26[0xea] = '\0';
      pcVar26[0xeb] = '\0';
      pcVar26[0xec] = '\0';
      pcVar26[0xed] = '\0';
      pcVar26[0xee] = '\0';
      pcVar26[0xef] = '\0';
      pcVar26[0xf0] = '\0';
      memset(pcVar26 + 0xf1,0x1b,0x3ff);
      pvVar11 = local_a0;
      pcVar26[0x4f0] = '\0';
      pcVar26[0x4f1] = '\0';
      pcVar26[0x4f2] = '\0';
      pcVar26[0x4f3] = '\0';
      pcVar26[0x4f8] = '\0';
      pcVar26[0x4f9] = '\0';
      pcVar26[0x4fa] = '\0';
      pcVar26[0x4fb] = '\0';
      pcVar26[0x4fc] = '\0';
      pcVar26[0x4fd] = '\0';
      pcVar26[0x4fe] = '\0';
      pcVar26[0x4ff] = '\0';
      pcVar26[0x500] = '\0';
      pcVar26[0x501] = '\0';
      pcVar26[0x502] = '\0';
      pcVar26[0x503] = '\0';
      pcVar26[0x504] = '\0';
      pcVar26[0x505] = '\0';
      pcVar26[0x506] = '\0';
      pcVar26[0x507] = '\0';
      pcVar26[0x508] = '\0';
      pcVar26[0x509] = '\0';
      pcVar26[0x50a] = '\0';
      pcVar26[0x50b] = '\0';
      pcVar26[0x50c] = '\0';
      pcVar26[0x50d] = '\0';
      pcVar26[0x50e] = '\0';
      pcVar26[0x50f] = '\0';
      pcVar26[0x510] = '\0';
      pcVar26[0x511] = '\0';
      pcVar26[0x512] = '\0';
      pcVar26[0x513] = '\0';
      pcVar26[0x514] = '\0';
      pcVar26[0x515] = '\0';
      pcVar26[0x516] = '\0';
      pcVar26[0x517] = '\0';
      pcVar26[0x518] = '\0';
      pcVar26[0x519] = '\0';
      pcVar26[0x51a] = '\0';
      pcVar26[0x51b] = '\0';
      pcVar26[0x70] = '\0';
      pcVar26[0x71] = '\0';
      pcVar26[0x72] = '\0';
      pcVar26[0x73] = '\0';
      pcVar26[0x74] = '\0';
      pcVar26[0x75] = '\0';
      pcVar26[0x76] = '\0';
      pcVar26[0x77] = '\0';
      pcVar26[0x78] = '\0';
      pcVar26[0x79] = '\0';
      pcVar26[0x7a] = '\0';
      pcVar26[0x7b] = '\0';
      pcVar26[0x7c] = '\0';
      pcVar26[0x7d] = '\0';
      pcVar26[0x7e] = '\0';
      pcVar26[0x7f] = '\0';
      pcVar26[0x80] = '\0';
      pcVar26[0x81] = '\0';
      pcVar26[0x82] = '\0';
      pcVar26[0x83] = '\0';
      pcVar26[0x84] = '\0';
      pcVar26[0x85] = '\0';
      pcVar26[0x86] = '\0';
      pcVar26[0x87] = '\0';
      pcVar26[0x88] = '\0';
      pcVar26[0x89] = '\0';
      pcVar26[0x8a] = '\0';
      pcVar26[0x8b] = '\0';
      pcVar26[0x8c] = '\0';
      pcVar26[0x8d] = '\0';
      pcVar26[0x8e] = '\0';
      pcVar26[0x8f] = '\0';
      pcVar26[0x90] = '\0';
      pcVar26[0x91] = '\0';
      pcVar26[0x92] = '\0';
      pcVar26[0x93] = '\0';
      pcVar26[0x94] = '\0';
      pcVar26[0x95] = '\0';
      pcVar26[0x96] = '\0';
      pcVar26[0x97] = '\0';
      pcVar26[0x98] = '\0';
      pcVar26[0x99] = '\0';
      pcVar26[0x9a] = '\0';
      pcVar26[0x9b] = '\0';
      pcVar26[0x9c] = '\0';
      pcVar26[0x9d] = '\0';
      pcVar26[0x9e] = '\0';
      pcVar26[0x9f] = '\0';
      pcVar26[0xa0] = '\0';
      pcVar26[0xa1] = '\0';
      pcVar26[0xa2] = '\0';
      pcVar26[0xa3] = '\0';
      pcVar26[0xa4] = '\0';
      pcVar26[0xa5] = '\0';
      pcVar26[0xa6] = '\0';
      pcVar26[0xa7] = '\0';
      pcVar26[0xa8] = '\0';
      pcVar26[0xa9] = '\0';
      pcVar26[0xaa] = '\0';
      pcVar26[0xab] = '\0';
      pcVar26[0xac] = '\0';
      pcVar26[0xad] = '\0';
      pcVar26[0xae] = '\0';
      pcVar26[0xaf] = '\0';
      pcVar26[0xb0] = '\0';
      pcVar26[0xb1] = '\0';
      pcVar26[0xb2] = '\0';
      pcVar26[0xb3] = '\0';
      pcVar26[0xb4] = '\0';
      pcVar26[0xb5] = '\0';
      pcVar26[0xb6] = '\0';
      pcVar26[0xb7] = '\0';
      pcVar26[0xb8] = '\0';
      pcVar26[0xb9] = '\0';
      pcVar26[0xba] = '\0';
      pcVar26[0xbb] = '\0';
      pcVar26[0xbc] = '\0';
      pcVar26[0xbd] = '\0';
      pcVar26[0xbe] = '\0';
      pcVar26[0xbf] = '\0';
      pcVar26[0xc0] = '\0';
      pcVar26[0xc1] = '\0';
      pcVar26[0xc2] = '\0';
      pcVar26[0xc3] = '\0';
      pcVar26[0xc4] = '\0';
      pcVar26[0xc5] = '\0';
      pcVar26[0xc6] = '\0';
      pcVar26[199] = '\0';
      pcVar26[200] = '\0';
      pcVar26[0xc9] = '\0';
      pcVar26[0xca] = '\0';
      pcVar26[0xcb] = '\0';
      pcVar26[0xcc] = '\0';
      pcVar26[0xcd] = '\0';
      pcVar26[0xce] = '\0';
      pcVar26[0xcf] = '\0';
      pcVar26[0x30] = '\0';
      pcVar26[0x31] = '\0';
      pcVar26[0x32] = '\0';
      pcVar26[0x33] = '\0';
      pcVar26[0x34] = '\0';
      pcVar26[0x35] = '\0';
      pcVar26[0x36] = '\0';
      pcVar26[0x37] = '\0';
      pcVar26[0x38] = '\0';
      pcVar26[0x39] = '\0';
      pcVar26[0x3a] = '\0';
      pcVar26[0x3b] = '\0';
      pcVar26[0x3c] = '\0';
      pcVar26[0x3d] = '\0';
      pcVar26[0x3e] = '\0';
      pcVar26[0x3f] = '\0';
      pcVar26[0x40] = '\0';
      pcVar26[0x41] = '\0';
      pcVar26[0x42] = '\0';
      pcVar26[0x43] = '\0';
      pcVar26[0x44] = '\0';
      pcVar26[0x45] = '\0';
      pcVar26[0x46] = '\0';
      pcVar26[0x47] = '\0';
      pcVar26[0x48] = '\0';
      pcVar26[0x49] = '\0';
      pcVar26[0x4a] = '\0';
      pcVar26[0x4b] = '\0';
      pcVar26[0x4c] = '\0';
      pcVar26[0x4d] = '\0';
      pcVar26[0x4e] = '\0';
      pcVar26[0x4f] = '\0';
      pcVar26[0x50] = '\0';
      pcVar26[0x51] = '\0';
      pcVar26[0x52] = '\0';
      pcVar26[0x53] = '\0';
      pcVar26[0x54] = '\0';
      pcVar26[0x55] = '\0';
      pcVar26[0x56] = '\0';
      pcVar26[0x57] = '\0';
      pcVar26[0x58] = '\0';
      pcVar26[0x59] = '\0';
      pcVar26[0x5a] = '\0';
      pcVar26[0x5b] = '\0';
      pcVar26[0x5c] = '\0';
      pcVar26[0x5d] = '\0';
      pcVar26[0x5e] = '\0';
      pcVar26[0x5f] = '\0';
      pcVar26[0x60] = '\0';
      pcVar26[0x61] = '\0';
      pcVar26[0x62] = '\0';
      pcVar26[99] = '\0';
      pcVar26[100] = '\0';
      pcVar26[0x65] = '\0';
      pcVar26[0x66] = '\0';
      pcVar26[0x67] = '\0';
      pcVar26[0x68] = '\0';
      pcVar26[0x69] = '\0';
      pcVar26[0x6a] = '\0';
      pcVar26[0x6b] = '\0';
      pcVar26[0x6c] = '\0';
      pcVar26[0x6d] = '\0';
      pcVar26[0x6e] = '\0';
      pcVar26[0x6f] = '\0';
      local_e0._M_dataplus._M_p = pcVar26;
      std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
                (local_a0,(aiMesh **)&local_e0);
      lVar37 = *(long *)(*(long *)(pvVar11 + 8) + -8);
      uVar18 = ((long)(object->vertices).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(object->vertices).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      uVar14 = (undefined4)uVar18;
      *(undefined4 *)(lVar37 + 4) = uVar14;
      *(undefined4 *)(lVar37 + 8) = uVar14;
      uVar18 = uVar18 & 0xffffffff;
      puVar21 = (ulong *)operator_new__(uVar18 * 0x10 + 8);
      *puVar21 = uVar18;
      puVar21 = puVar21 + 1;
      if (uVar18 != 0) {
        puVar27 = puVar21;
        do {
          *(undefined4 *)puVar27 = 0;
          puVar27[1] = 0;
          puVar27 = puVar27 + 2;
        } while (puVar27 != puVar21 + uVar18 * 2);
      }
      *(ulong **)(lVar37 + 0xd0) = puVar21;
      uVar43 = *(uint *)(lVar37 + 4);
      __s_00 = operator_new__((ulong)uVar43 * 0xc);
      if (uVar43 != 0) {
        memset(__s_00,0,(((ulong)uVar43 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      *(void **)(lVar37 + 0x10) = __s_00;
      if (*(int *)(lVar37 + 4) != 0) {
        paVar4 = (local_b8->vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar45 = 0;
        uVar18 = 0;
        do {
          *(undefined4 *)((long)__s_00 + lVar45 + 8) = *(undefined4 *)((long)&paVar4->z + lVar45);
          *(undefined8 *)((long)__s_00 + lVar45) = *(undefined8 *)((long)&paVar4->x + lVar45);
          *(undefined4 *)puVar21 = 1;
          puVar28 = (undefined4 *)operator_new__(4);
          puVar21[1] = (ulong)puVar28;
          *puVar28 = (int)uVar18;
          uVar18 = uVar18 + 1;
          puVar21 = puVar21 + 2;
          lVar45 = lVar45 + 0xc;
        } while (uVar18 < *(uint *)(lVar37 + 4));
      }
      *(undefined4 *)(lVar37 + 0xe8) = 0;
      paVar20 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(paVar20);
      pAVar12 = local_60;
      pAVar40 = local_60;
      local_e0._M_dataplus._M_p = (pointer)paVar20;
      std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
                ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)local_60,
                 (aiMaterial **)&local_e0);
      object = local_b8;
      ConvertMaterial(pAVar40,local_b8,
                      (local_90->
                      super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      *(aiMaterial **)
                       (*(long *)&(pAVar12->super_BaseImporter).importerUnits._M_t._M_impl + -8));
    }
    else {
      local_e0._M_dataplus._M_p = (pointer)0x0;
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::vector(&local_88,
               ((long)(materials->
                      super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(materials->
                      super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3,
               (value_type *)&local_e0,(allocator_type *)&local_b0);
      pSVar42 = (object->surfaces).
                super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_50 = (object->surfaces).
                 super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar42 != local_50) {
        do {
          uVar43 = pSVar42->mat;
          if ((ulong)((long)local_88.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_88.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar43) {
            pLVar17 = DefaultLogger::get();
            uVar43 = 0;
            Logger::error(pLVar17,"AC3D: material index is out of range");
          }
          if ((pSVar42->entries).
              super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (pSVar42->entries).
              super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pLVar17 = DefaultLogger::get();
            Logger::warn(pLVar17,"AC3D: surface her zero vertex references");
          }
          ppVar47 = (pSVar42->entries).
                    super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar44 = (pSVar42->entries).
                         super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pSVar36 = local_50,
              object = local_b8, ppVar44 != ppVar47; ppVar44 = ppVar44 + 1) {
            uVar18 = ((long)(local_b8->vertices).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_b8->vertices).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
            if (uVar18 < ppVar44->first || uVar18 - ppVar44->first == 0) {
              pLVar17 = DefaultLogger::get();
              Logger::warn(pLVar17,"AC3D: Invalid vertex reference");
              ppVar44->first = 0;
            }
          }
          if (local_88.
              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar43].first == 0) {
            local_98->mNumMeshes = local_98->mNumMeshes + 1;
          }
          uVar32 = pSVar42->flags & 0xf;
          if (uVar32 == 0) {
LAB_003df828:
            local_88.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar43].first =
                 local_88.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar43].first + 1;
            iVar13 = (int)((ulong)((long)(pSVar42->entries).
                                         super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pSVar42->entries).
                                        super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x55555555;
LAB_003df843:
            local_88.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar43].second =
                 local_88.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar43].second + iVar13;
          }
          else {
            if (uVar32 != 2) {
              if (uVar32 != 1) {
                pLVar17 = DefaultLogger::get();
                Logger::warn(pLVar17,"AC3D: The type flag of a surface is unknown");
                *(byte *)&pSVar42->flags = (byte)pSVar42->flags & 0xf0;
                goto LAB_003df828;
              }
              local_88.
              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar43].first =
                   local_88.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar43].first +
                   (int)((ulong)((long)(pSVar42->entries).
                                       super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pSVar42->entries).
                                      super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555
              ;
              iVar13 = (int)((ulong)((long)(pSVar42->entries).
                                           super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pSVar42->entries).
                                          super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                       0x55555556;
              goto LAB_003df843;
            }
            local_88.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar43].first =
                 ((int)((ulong)((long)(pSVar42->entries).
                                      super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pSVar42->entries).
                                     super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555
                 + local_88.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar43].first) - 1;
            local_88.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar43].second =
                 ((int)((ulong)((long)(pSVar42->entries).
                                      super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pSVar42->entries).
                                     super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x55555556 +
                 local_88.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar43].second) - 2;
          }
          pSVar42 = pSVar42 + 1;
        } while (pSVar42 != pSVar36);
      }
      paVar16 = local_98;
      local_40 = (uint *)operator_new__((ulong)local_98->mNumMeshes << 2);
      paVar16->mMeshes = local_40;
      local_70 = (long)*(pointer *)(local_a0 + 8) - *(long *)local_a0;
      local_38 = local_88.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_88.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_88.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar43 = 0;
        ppVar24 = local_88.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar46 = local_90;
        do {
          if (ppVar24->first != 0) {
            *local_40 = (uint)((ulong)((long)*(pointer *)(local_a0 + 8) - *(long *)local_a0) >> 3);
            local_58 = ppVar24;
            paVar19 = (aiMesh *)operator_new(0x520);
            paVar19->mPrimitiveTypes = 0;
            paVar19->mNumVertices = 0;
            paVar19->mNumFaces = 0;
            local_c0 = uVar43;
            memset(&paVar19->mVertices,0,0xcc);
            paVar19->mBones = (aiBone **)0x0;
            paVar19->mMaterialIndex = 0;
            (paVar19->mName).length = 0;
            (paVar19->mName).data[0] = '\0';
            memset((paVar19->mName).data + 1,0x1b,0x3ff);
            paVar19->mNumAnimMeshes = 0;
            paVar19->mAnimMeshes = (aiAnimMesh **)0x0;
            paVar19->mMethod = 0;
            (paVar19->mAABB).mMin.x = 0.0;
            (paVar19->mAABB).mMin.y = 0.0;
            (paVar19->mAABB).mMin.z = 0.0;
            (paVar19->mAABB).mMax.x = 0.0;
            (paVar19->mAABB).mMax.y = 0.0;
            (paVar19->mAABB).mMax.z = 0.0;
            paVar19->mTextureCoords[0] = (aiVector3D *)0x0;
            paVar19->mTextureCoords[1] = (aiVector3D *)0x0;
            paVar19->mTextureCoords[2] = (aiVector3D *)0x0;
            paVar19->mTextureCoords[3] = (aiVector3D *)0x0;
            paVar19->mTextureCoords[4] = (aiVector3D *)0x0;
            paVar19->mTextureCoords[5] = (aiVector3D *)0x0;
            paVar19->mTextureCoords[6] = (aiVector3D *)0x0;
            paVar19->mTextureCoords[7] = (aiVector3D *)0x0;
            paVar19->mNumUVComponents[0] = 0;
            paVar19->mNumUVComponents[1] = 0;
            paVar19->mNumUVComponents[2] = 0;
            paVar19->mNumUVComponents[3] = 0;
            paVar19->mNumUVComponents[4] = 0;
            paVar19->mNumUVComponents[5] = 0;
            paVar19->mNumUVComponents[6] = 0;
            paVar19->mNumUVComponents[7] = 0;
            paVar19->mColors[0] = (aiColor4D *)0x0;
            paVar19->mColors[1] = (aiColor4D *)0x0;
            paVar19->mColors[2] = (aiColor4D *)0x0;
            paVar19->mColors[3] = (aiColor4D *)0x0;
            paVar19->mColors[4] = (aiColor4D *)0x0;
            paVar19->mColors[5] = (aiColor4D *)0x0;
            paVar19->mColors[6] = (aiColor4D *)0x0;
            paVar19->mColors[7] = (aiColor4D *)0x0;
            __position._M_current = *(aiMesh ***)(local_a0 + 8);
            local_b0 = paVar19;
            if (__position._M_current == *(aiMesh ***)(local_a0 + 0x10)) {
              std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                        (local_a0,__position,&local_b0);
            }
            else {
              *__position._M_current = paVar19;
              *(long *)(local_a0 + 8) = *(long *)(local_a0 + 8) + 8;
            }
            pAVar12 = local_60;
            uVar43 = local_c0;
            local_b0->mMaterialIndex =
                 (uint)((ulong)(*(long *)&(local_60->super_BaseImporter).importerUnits._M_t._M_impl
                               - (long)(local_60->super_BaseImporter)._vptr_BaseImporter) >> 3);
            paVar20 = (aiMaterial *)operator_new(0x10);
            aiMaterial::aiMaterial(paVar20);
            pAVar40 = pAVar12;
            local_e0._M_dataplus._M_p = (pointer)paVar20;
            std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
                      ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)pAVar12,
                       (aiMaterial **)&local_e0);
            ConvertMaterial(pAVar40,object,
                            (pvVar46->
                            super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar43,
                            *(aiMaterial **)
                             (*(long *)&(pAVar12->super_BaseImporter).importerUnits._M_t._M_impl +
                             -8));
            paVar19 = local_b0;
            uVar32 = local_58->first;
            uVar18 = (ulong)uVar32;
            local_b0->mNumFaces = uVar32;
            if (uVar18 == 0) {
              prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e0,"AC3D: No faces","");
              std::runtime_error::runtime_error(prVar31,(string *)&local_e0);
              *(undefined ***)prVar31 = &PTR__runtime_error_008e3168;
              __cxa_throw(prVar31,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            if (0x1000000 < uVar32) {
              prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e0,"AC3D: Too many faces, would run out of memory","");
              std::runtime_error::runtime_error(prVar31,(string *)&local_e0);
              *(undefined ***)prVar31 = &PTR__runtime_error_008e3168;
              __cxa_throw(prVar31,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            puVar21 = (ulong *)operator_new__(uVar18 * 0x10 + 8);
            paVar10 = local_b0;
            local_40 = local_40 + 1;
            *puVar21 = uVar18;
            paVar34 = (aiFace *)(puVar21 + 1);
            paVar33 = paVar34;
            do {
              paVar33->mNumIndices = 0;
              paVar33->mIndices = (uint *)0x0;
              paVar33 = paVar33 + 1;
            } while (paVar33 != (aiFace *)(puVar21 + uVar18 * 2 + 1));
            paVar19->mFaces = paVar34;
            paVar19->mNumVertices = local_58->second;
            uVar32 = local_b0->mNumVertices;
            if (uVar32 == 0) {
              prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e0,"AC3D: No vertices","");
              std::runtime_error::runtime_error(prVar31,(string *)&local_e0);
              *(undefined ***)prVar31 = &PTR__runtime_error_008e3168;
              __cxa_throw(prVar31,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            if (0x1555555 < uVar32) {
              prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e0,"AC3D: Too many vertices, would run out of memory","");
              std::runtime_error::runtime_error(prVar31,(string *)&local_e0);
              *(undefined ***)prVar31 = &PTR__runtime_error_008e3168;
              __cxa_throw(prVar31,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            __s = (aiVector3D *)operator_new__((ulong)uVar32 * 0xc);
            memset(__s,0,(((ulong)uVar32 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            paVar10->mVertices = __s;
            if ((object->texture)._M_string_length == 0) {
              paVar22 = (aiVector3D *)0x0;
            }
            else {
              uVar18 = (ulong)paVar10->mNumVertices;
              paVar22 = (aiVector3D *)operator_new__(uVar18 * 0xc);
              if (uVar18 != 0) {
                memset(paVar22,0,((uVar18 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar10->mTextureCoords[0] = paVar22;
              paVar10->mNumUVComponents[0] = 2;
            }
            pSVar42 = (object->surfaces).
                      super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar24 = local_58;
            pvVar46 = local_90;
            if (pSVar42 != local_50) {
              uVar32 = 0;
              pSVar36 = local_50;
              do {
                paVar33 = paVar34;
                if (uVar43 == pSVar42->mat) {
                  ppVar44 = (pSVar42->entries).
                            super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  uVar41 = pSVar42->flags & 0xf;
                  local_48 = pSVar42;
                  if (uVar41 == 0) {
                    paVar33 = paVar34 + 1;
                    uVar18 = ((long)ppVar44 -
                              (long)(pSVar42->entries).
                                    super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x5555555555555555;
                    uVar41 = (uint)uVar18;
                    paVar34->mNumIndices = uVar41;
                    if (uVar41 != 0) {
                      local_bc = uVar32;
                      puVar23 = (uint *)operator_new__((uVar18 & 0xffffffff) << 2);
                      paVar34->mIndices = puVar23;
                      pSVar42 = local_48;
                      uVar43 = local_c0;
                      uVar32 = local_bc;
                      if (paVar34->mNumIndices != 0) {
                        uVar18 = 0;
                        lVar37 = 0;
                        do {
                          lVar45 = lVar37;
                          ppVar44 = (local_48->entries).
                                    super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          paVar34->mIndices[uVar18] = local_bc + (int)uVar18;
                          if (local_b0->mNumVertices <=
                              (uint)((int)((ulong)((long)__s + (lVar45 - (long)local_b0->mVertices))
                                          >> 2) * -0x55555555)) {
                            prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
                            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_e0,"AC3D: Invalid number of vertices","");
                            std::runtime_error::runtime_error(prVar31,(string *)&local_e0);
                            *(undefined ***)prVar31 = &PTR__runtime_error_008e3168;
                            __cxa_throw(prVar31,&DeadlyImportError::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          uVar32 = *(uint *)((long)&ppVar44->first + lVar45);
                          paVar4 = (object->vertices).
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          fVar1 = paVar4[uVar32].z;
                          fVar2 = (object->translation).z;
                          *(ulong *)((long)&__s->x + lVar45) =
                               CONCAT44(paVar4[uVar32].y + (object->translation).y,
                                        paVar4[uVar32].x + (object->translation).x);
                          *(float *)((long)&__s->z + lVar45) = fVar1 + fVar2;
                          if (paVar22 == (aiVector3D *)0x0) {
                            paVar22 = (aiVector3D *)0x0;
                          }
                          else {
                            paVar22->x = *(float *)((long)&(ppVar44->second).x + lVar45);
                            paVar22->y = *(float *)((long)&(ppVar44->second).y + lVar45);
                            paVar22 = paVar22 + 1;
                          }
                          uVar18 = uVar18 + 1;
                          lVar37 = lVar45 + 0xc;
                        } while (uVar18 < paVar34->mNumIndices);
                        __s = (aiVector3D *)((long)&__s[1].x + lVar45);
                        uVar32 = local_bc + (int)uVar18;
                      }
                    }
                  }
                  else {
                    ppVar47 = (pSVar42->entries).
                              super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar38 = (int)((ulong)((long)ppVar44 - (long)ppVar47) >> 2) * -0x55555555 -
                             (uint)(uVar41 == 2);
                    uVar43 = local_c0;
                    if (uVar38 != 0) {
                      do {
                        uVar43 = uVar32;
                        paVar39 = __s;
                        paVar33 = paVar34;
                        paVar33->mNumIndices = 2;
                        local_bc = uVar38;
                        puVar23 = (uint *)operator_new__(8);
                        paVar33->mIndices = puVar23;
                        *puVar23 = uVar43;
                        paVar33->mIndices[1] = uVar43 + 1;
                        if (ppVar47 ==
                            (local_48->entries).
                            super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                          prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
                          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_e0,"AC3D: Bad line","");
                          std::runtime_error::runtime_error(prVar31,(string *)&local_e0);
                          *(undefined ***)prVar31 = &PTR__runtime_error_008e3168;
                          __cxa_throw(prVar31,&DeadlyImportError::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        uVar18 = (ulong)ppVar47->first;
                        paVar4 = (local_b8->vertices).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        uVar35 = ((long)(local_b8->vertices).
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)paVar4 >>
                                 2) * -0x5555555555555555;
                        if (uVar35 < uVar18 || uVar35 - uVar18 == 0) {
                          __assert_fail("(*it2).first < object.vertices.size()",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/AC/ACLoader.cpp"
                                        ,0x2a3,
                                        "aiNode *Assimp::AC3DImporter::ConvertObjectSection(Object &, std::vector<aiMesh *> &, std::vector<aiMaterial *> &, const std::vector<Material> &, aiNode *)"
                                       );
                        }
                        paVar39->z = paVar4[uVar18].z;
                        fVar1 = paVar4[uVar18].y;
                        paVar39->x = paVar4[uVar18].x;
                        paVar39->y = fVar1;
                        if (paVar22 == (aiVector3D *)0x0) {
                          paVar22 = (aiVector3D *)0x0;
                        }
                        else {
                          paVar22->x = (ppVar47->second).x;
                          paVar22->y = (ppVar47->second).y;
                          paVar22 = paVar22 + 1;
                        }
                        if ((uVar41 == 1) && (local_bc == 1)) {
                          ppVar47 = (local_48->entries).
                                    super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                        else {
                          ppVar47 = ppVar47 + 1;
                        }
                        uVar32 = ppVar47->first;
                        paVar4 = (local_b8->vertices).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        paVar39[1].z = paVar4[uVar32].z;
                        paVar4 = paVar4 + uVar32;
                        fVar1 = paVar4->y;
                        paVar39[1].x = paVar4->x;
                        paVar39[1].y = fVar1;
                        if (paVar22 == (aiVector3D *)0x0) {
                          paVar22 = (aiVector3D *)0x0;
                        }
                        else {
                          paVar22->x = (ppVar47->second).x;
                          paVar22->y = (ppVar47->second).y;
                          paVar22 = paVar22 + 1;
                        }
                        uVar38 = local_bc - 1;
                        paVar34 = paVar33 + 1;
                        __s = paVar39 + 2;
                        uVar32 = uVar43 + 2;
                      } while (uVar38 != 0);
                      uVar32 = uVar43 + 2;
                      __s = paVar39 + 2;
                      pSVar36 = local_50;
                      pSVar42 = local_48;
                      object = local_b8;
                      paVar33 = paVar33 + 1;
                      uVar43 = local_c0;
                    }
                  }
                }
                paVar34 = paVar33;
                pSVar42 = pSVar42 + 1;
                ppVar24 = local_58;
                pvVar46 = local_90;
              } while (pSVar42 != pSVar36);
            }
          }
          ppVar24 = ppVar24 + 1;
          uVar43 = uVar43 + 1;
        } while (ppVar24 != local_38);
      }
      pvVar11 = local_a0;
      if (object->subDiv != 0) {
        if (local_68->configEvalSubdivision == true) {
          pSVar25 = Subdivider::Create(CATMULL_CLARKE);
          pLVar17 = DefaultLogger::get();
          std::operator+(&local_e0,"AC3D: Evaluating subdivision surface: ",&object->name);
          Logger::info(pLVar17,local_e0._M_dataplus._M_p);
          lVar37 = local_70 >> 3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          local_b0 = (aiMesh *)0x0;
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&local_e0,
                     ((long)*(pointer *)(pvVar11 + 8) - *(long *)pvVar11 >> 3) - lVar37,&local_b0,
                     &local_a1);
          (*pSVar25->_vptr_Subdivider[3])
                    (pSVar25,*(long *)pvVar11 + local_70,
                     (long)(local_e0._M_string_length - (long)local_e0._M_dataplus._M_p) >> 3,
                     local_e0._M_dataplus._M_p,(ulong)object->subDiv,1);
          if (local_e0._M_string_length - (long)local_e0._M_dataplus._M_p != 0) {
            memmove((void *)(local_70 + *(long *)pvVar11),local_e0._M_dataplus._M_p,
                    local_e0._M_string_length - (long)local_e0._M_dataplus._M_p);
          }
          if ((aiMaterial *)local_e0._M_dataplus._M_p != (aiMaterial *)0x0) {
            operator_delete(local_e0._M_dataplus._M_p,
                            local_e0.field_2._M_allocated_capacity - (long)local_e0._M_dataplus._M_p
                           );
          }
          (*pSVar25->_vptr_Subdivider[1])(pSVar25);
        }
        else {
          pLVar17 = DefaultLogger::get();
          std::operator+(&local_e0,
                         "AC3D: Letting the subdivision surface untouched due to my configuration: "
                         ,&object->name);
          Logger::info(pLVar17,local_e0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if (local_88.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  paVar16 = local_98;
  uVar18 = (object->name)._M_string_length;
  if (uVar18 == 0) {
    switch(object->type) {
    case World:
      local_68->worlds = local_68->worlds + 1;
      __format = "ACWorld_%i";
      break;
    case Poly:
      local_68->polys = local_68->polys + 1;
      __format = "ACPoly_%i";
      break;
    case Group:
      local_68->groups = local_68->groups + 1;
      __format = "ACGroup_%i";
      break;
    default:
      goto switchD_003e02db_caseD_3;
    case Light:
      local_68->lights = local_68->lights + 1;
      __format = "ACLight_%i";
    }
    aVar15 = snprintf((local_98->mName).data,0x400,__format);
    (paVar16->mName).length = aVar15;
  }
  else if (uVar18 < 0x400) {
    (local_98->mName).length = (ai_uint32)uVar18;
    memcpy((local_98->mName).data,(object->name)._M_dataplus._M_p,uVar18);
    (paVar16->mName).data[uVar18] = '\0';
  }
switchD_003e02db_caseD_3:
  pAVar40 = local_60;
  pAVar12 = local_68;
  pvVar11 = local_a0;
  fVar5 = (object->rotation).a2;
  fVar1 = (object->rotation).a3;
  fVar6 = (object->rotation).b1;
  fVar7 = (object->rotation).b2;
  fVar2 = (object->rotation).b3;
  fVar8 = (object->rotation).c1;
  fVar9 = (object->rotation).c2;
  fVar3 = (object->rotation).c3;
  (paVar16->mTransformation).a1 = (object->rotation).a1;
  (paVar16->mTransformation).a2 = fVar5;
  (paVar16->mTransformation).a3 = fVar1;
  (paVar16->mTransformation).a4 = 0.0;
  (paVar16->mTransformation).b1 = fVar6;
  (paVar16->mTransformation).b2 = fVar7;
  (paVar16->mTransformation).b3 = fVar2;
  (paVar16->mTransformation).b4 = 0.0;
  (paVar16->mTransformation).c1 = fVar8;
  (paVar16->mTransformation).c2 = fVar9;
  (paVar16->mTransformation).c3 = fVar3;
  (paVar16->mTransformation).c4 = 0.0;
  (paVar16->mTransformation).d1 = 0.0;
  (paVar16->mTransformation).d2 = 0.0;
  (paVar16->mTransformation).d3 = 0.0;
  (paVar16->mTransformation).d4 = 1.0;
  if ((object->type == Group) || (object->numRefs == 0)) {
    (paVar16->mTransformation).a4 = (object->translation).x;
    (paVar16->mTransformation).b4 = (object->translation).y;
    (paVar16->mTransformation).c4 = (object->translation).z;
  }
  lVar37 = (long)(object->children).
                 super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(object->children).
                 super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar37 != 0) {
    uVar18 = (lVar37 >> 5) * 0x6db6db6db6db6db7;
    uVar43 = (uint)uVar18;
    paVar16->mNumChildren = uVar43;
    ppaVar29 = (aiNode **)operator_new__((uVar18 & 0xffffffff) << 3);
    paVar16->mChildren = ppaVar29;
    if (uVar43 != 0) {
      lVar37 = 0;
      uVar18 = 0;
      do {
        paVar30 = ConvertObjectSection
                            (pAVar12,(Object *)
                                     ((long)&((local_b8->children).
                                              super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->type +
                                     lVar37),(vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pvVar11,
                             (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)pAVar40,local_90
                             ,paVar16);
        paVar16->mChildren[uVar18] = paVar30;
        uVar18 = uVar18 + 1;
        lVar37 = lVar37 + 0xe0;
      } while (uVar18 < paVar16->mNumChildren);
    }
  }
  return paVar16;
}

Assistant:

aiNode* AC3DImporter::ConvertObjectSection(Object& object,
    std::vector<aiMesh*>& meshes,
    std::vector<aiMaterial*>& outMaterials,
    const std::vector<Material>& materials,
    aiNode* parent)
{
    aiNode* node = new aiNode();
    node->mParent = parent;
    if (object.vertices.size())
    {
        if (!object.surfaces.size() || !object.numRefs)
        {
            /* " An object with 7 vertices (no surfaces, no materials defined).
                 This is a good way of getting point data into AC3D.
                 The Vertex->create convex-surface/object can be used on these
                 vertices to 'wrap' a 3d shape around them "
                 (http://www.opencity.info/html/ac3dfileformat.html)

                 therefore: if no surfaces are defined return point data only
             */

            ASSIMP_LOG_INFO("AC3D: No surfaces defined in object definition, "
                "a point list is returned");

            meshes.push_back(new aiMesh());
            aiMesh* mesh = meshes.back();

            mesh->mNumFaces = mesh->mNumVertices = (unsigned int)object.vertices.size();
            aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];
            aiVector3D* verts = mesh->mVertices = new aiVector3D[mesh->mNumVertices];

            for (unsigned int i = 0; i < mesh->mNumVertices;++i,++faces,++verts)
            {
                *verts = object.vertices[i];
                faces->mNumIndices = 1;
                faces->mIndices = new unsigned int[1];
                faces->mIndices[0] = i;
            }

            // use the primary material in this case. this should be the
            // default material if all objects of the file contain points
            // and no faces.
            mesh->mMaterialIndex = 0;
            outMaterials.push_back(new aiMaterial());
            ConvertMaterial(object, materials[0], *outMaterials.back());
        }
        else
        {
            // need to generate one or more meshes for this object.
            // find out how many different materials we have
            typedef std::pair< unsigned int, unsigned int > IntPair;
            typedef std::vector< IntPair > MatTable;
            MatTable needMat(materials.size(),IntPair(0,0));

            std::vector<Surface>::iterator it,end = object.surfaces.end();
            std::vector<Surface::SurfaceEntry>::iterator it2,end2;

            for (it = object.surfaces.begin(); it != end; ++it)
            {
                unsigned int idx = (*it).mat;
                if (idx >= needMat.size())
                {
                    ASSIMP_LOG_ERROR("AC3D: material index is out of range");
                    idx = 0;
                }
                if ((*it).entries.empty())
                {
                    ASSIMP_LOG_WARN("AC3D: surface her zero vertex references");
                }

                // validate all vertex indices to make sure we won't crash here
                for (it2  = (*it).entries.begin(),
                     end2 = (*it).entries.end(); it2 != end2; ++it2)
                {
                    if ((*it2).first >= object.vertices.size())
                    {
                        ASSIMP_LOG_WARN("AC3D: Invalid vertex reference");
                        (*it2).first = 0;
                    }
                }

                if (!needMat[idx].first)++node->mNumMeshes;

                switch ((*it).flags & 0xf)
                {
                    // closed line
                case 0x1:

                    needMat[idx].first  += (unsigned int)(*it).entries.size();
                    needMat[idx].second += (unsigned int)(*it).entries.size()<<1u;
                    break;

                    // unclosed line
                case 0x2:

                    needMat[idx].first  += (unsigned int)(*it).entries.size()-1;
                    needMat[idx].second += ((unsigned int)(*it).entries.size()-1)<<1u;
                    break;

                    // 0 == polygon, else unknown
                default:

                    if ((*it).flags & 0xf)
                    {
                        ASSIMP_LOG_WARN("AC3D: The type flag of a surface is unknown");
                        (*it).flags &= ~(0xf);
                    }

                    // the number of faces increments by one, the number
                    // of vertices by surface.numref.
                    needMat[idx].first++;
                    needMat[idx].second += (unsigned int)(*it).entries.size();
                };
            }
            unsigned int* pip = node->mMeshes = new unsigned int[node->mNumMeshes];
            unsigned int mat = 0;
            const size_t oldm = meshes.size();
            for (MatTable::const_iterator cit = needMat.begin(), cend = needMat.end();
                cit != cend; ++cit, ++mat)
            {
                if (!(*cit).first)continue;

                // allocate a new aiMesh object
                *pip++ = (unsigned int)meshes.size();
                aiMesh* mesh = new aiMesh();
                meshes.push_back(mesh);

                mesh->mMaterialIndex = (unsigned int)outMaterials.size();
                outMaterials.push_back(new aiMaterial());
                ConvertMaterial(object, materials[mat], *outMaterials.back());

                // allocate storage for vertices and normals
                mesh->mNumFaces = (*cit).first;
                if (mesh->mNumFaces == 0) {
                    throw DeadlyImportError("AC3D: No faces");
                } else if (mesh->mNumFaces > AI_MAX_ALLOC(aiFace)) {
                    throw DeadlyImportError("AC3D: Too many faces, would run out of memory");
                }
                aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];

                mesh->mNumVertices = (*cit).second;
                if (mesh->mNumVertices == 0) {
                    throw DeadlyImportError("AC3D: No vertices");
                } else if (mesh->mNumVertices > AI_MAX_ALLOC(aiVector3D)) {
                    throw DeadlyImportError("AC3D: Too many vertices, would run out of memory");
                }
                aiVector3D* vertices = mesh->mVertices = new aiVector3D[mesh->mNumVertices];
                unsigned int cur = 0;

                // allocate UV coordinates, but only if the texture name for the
                // surface is not empty
                aiVector3D* uv = NULL;
                if(object.texture.length())
                {
                    uv = mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumVertices];
                    mesh->mNumUVComponents[0] = 2;
                }

                for (it = object.surfaces.begin(); it != end; ++it)
                {
                    if (mat == (*it).mat)
                    {
                        const Surface& src = *it;

                        // closed polygon
                        unsigned int type = (*it).flags & 0xf;
                        if (!type)
                        {
                            aiFace& face = *faces++;
                            if((face.mNumIndices = (unsigned int)src.entries.size()))
                            {
                                face.mIndices = new unsigned int[face.mNumIndices];
                                for (unsigned int i = 0; i < face.mNumIndices;++i,++vertices)
                                {
                                    const Surface::SurfaceEntry& entry = src.entries[i];
                                    face.mIndices[i] = cur++;

                                    // copy vertex positions
                                    if (static_cast<unsigned>(vertices - mesh->mVertices) >= mesh->mNumVertices) {
                                        throw DeadlyImportError("AC3D: Invalid number of vertices");
                                    }
                                    *vertices = object.vertices[entry.first] + object.translation;


                                    // copy texture coordinates
                                    if (uv)
                                    {
                                        uv->x =  entry.second.x;
                                        uv->y =  entry.second.y;
                                        ++uv;
                                    }
                                }
                            }
                        }
                        else
                        {

                            it2  = (*it).entries.begin();

                            // either a closed or an unclosed line
                            unsigned int tmp = (unsigned int)(*it).entries.size();
                            if (0x2 == type)--tmp;
                            for (unsigned int m = 0; m < tmp;++m)
                            {
                                aiFace& face = *faces++;

                                face.mNumIndices = 2;
                                face.mIndices = new unsigned int[2];
                                face.mIndices[0] = cur++;
                                face.mIndices[1] = cur++;

                                // copy vertex positions
                                if (it2 == (*it).entries.end() ) {
                                    throw DeadlyImportError("AC3D: Bad line");
                                }
                                ai_assert((*it2).first < object.vertices.size());
                                *vertices++ = object.vertices[(*it2).first];

                                // copy texture coordinates
                                if (uv)
                                {
                                    uv->x =  (*it2).second.x;
                                    uv->y =  (*it2).second.y;
                                    ++uv;
                                }


                                if (0x1 == type && tmp-1 == m)
                                {
                                    // if this is a closed line repeat its beginning now
                                    it2  = (*it).entries.begin();
                                }
                                else ++it2;

                                // second point
                                *vertices++ = object.vertices[(*it2).first];

                                if (uv)
                                {
                                    uv->x =  (*it2).second.x;
                                    uv->y =  (*it2).second.y;
                                    ++uv;
                                }
                            }
                        }
                    }
                }
            }

            // Now apply catmull clark subdivision if necessary. We split meshes into
            // materials which is not done by AC3D during smoothing, so we need to
            // collect all meshes using the same material group.
            if (object.subDiv)  {
                if (configEvalSubdivision) {
                    std::unique_ptr<Subdivider> div(Subdivider::Create(Subdivider::CATMULL_CLARKE));
                    ASSIMP_LOG_INFO("AC3D: Evaluating subdivision surface: "+object.name);

                    std::vector<aiMesh*> cpy(meshes.size()-oldm,NULL);
                    div->Subdivide(&meshes[oldm],cpy.size(),&cpy.front(),object.subDiv,true);
                    std::copy(cpy.begin(),cpy.end(),meshes.begin()+oldm);

                    // previous meshes are deleted vy Subdivide().
                }
                else {
                    ASSIMP_LOG_INFO("AC3D: Letting the subdivision surface untouched due to my configuration: "
                        +object.name);
                }
            }
        }
    }

    if (object.name.length())
        node->mName.Set(object.name);
    else
    {
        // generate a name depending on the type of the node
        switch (object.type)
        {
        case Object::Group:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACGroup_%i",groups++);
            break;
        case Object::Poly:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACPoly_%i",polys++);
            break;
        case Object::Light:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACLight_%i",lights++);
            break;

            // there shouldn't be more than one world, but we don't care
        case Object::World:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACWorld_%i",worlds++);
            break;
        }
    }


    // setup the local transformation matrix of the object
    // compute the transformation offset to the parent node
    node->mTransformation = aiMatrix4x4 ( object.rotation );

    if (object.type == Object::Group || !object.numRefs)
    {
        node->mTransformation.a4 = object.translation.x;
        node->mTransformation.b4 = object.translation.y;
        node->mTransformation.c4 = object.translation.z;
    }

    // add children to the object
    if (object.children.size())
    {
        node->mNumChildren = (unsigned int)object.children.size();
        node->mChildren = new aiNode*[node->mNumChildren];
        for (unsigned int i = 0; i < node->mNumChildren;++i)
        {
            node->mChildren[i] = ConvertObjectSection(object.children[i],meshes,outMaterials,materials,node);
        }
    }

    return node;
}